

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O3

Container * __thiscall
IceCore::Container::FindPrev(Container *this,udword *entry,FindMode find_mode)

{
  ulong uVar1;
  udword *puVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar4 = (ulong)this->mCurNbEntries;
  if (uVar4 != 0) {
    puVar2 = this->mEntries;
    if (*puVar2 == *entry) {
      uVar5 = 0;
      if (find_mode == FIND_WRAP) {
        uVar5 = this->mCurNbEntries - 1;
      }
    }
    else {
      uVar6 = 0;
      do {
        if (uVar4 - 1 == uVar6) {
          return this;
        }
        uVar1 = uVar6 + 1;
        lVar3 = uVar6 + 1;
        uVar6 = uVar1;
      } while (puVar2[lVar3] != *entry);
      if (uVar4 <= uVar1) {
        return this;
      }
      uVar5 = (int)uVar1 - 1;
    }
    *entry = puVar2[uVar5];
  }
  return this;
}

Assistant:

Container& Container::FindPrev(udword& entry, FindMode find_mode)
{
	udword Location;
	if(Contains(entry, &Location))
	{
		Location--;
		if(Location==0xffffffff)	Location = find_mode==FIND_WRAP ? mCurNbEntries-1 : 0;
		entry = mEntries[Location];
	}
	return *this;
}